

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal64.c
# Opt level: O1

decNumber_conflict2 * decimal64ToNumber(decimal64 *d64,decNumber_conflict2 *dn)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  int32_t declets;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  uint32_t sourar [2];
  undefined8 local_28;
  
  uVar1 = *(uint *)d64->bytes;
  uVar2 = *(uint *)(d64->bytes + 4);
  local_28 = *(ulong *)d64->bytes;
  decNumberZero((decNumber_conflict *)dn);
  if ((int)uVar2 < 0) {
    dn->bits = 0x80;
  }
  uVar5 = uVar2 >> 0x1a & 0x1f;
  if ((~uVar2 & 0x78000000) == 0) {
    if (uVar5 != 0x1f) {
      dn->bits = dn->bits | 0x40;
      return dn;
    }
    if ((uVar2 >> 0x19 & 1) == 0) {
      bVar3 = 0x20;
    }
    else {
      bVar3 = 0x10;
    }
    dn->bits = dn->bits | bVar3;
    iVar4 = 0;
  }
  else {
    uVar6 = (ulong)(uVar5 << 2);
    iVar4 = *(int *)((long)COMBMSD + uVar6);
    dn->exponent = *(int *)((long)COMBEXP + uVar6) * 0x100 + (uVar2 >> 0x12 & 0xff) + -0x18e;
  }
  local_28 = CONCAT44(uVar2,(uint32_t)local_28) & 0x3ffffffffffff;
  if (iVar4 == 0) {
    if ((uVar2 & 0x3ffff) == 0) {
      if (uVar1 == 0) {
        return dn;
      }
      bVar7 = uVar1 < 0x40000000;
      iVar4 = 4;
    }
    else {
      bVar7 = (uVar2 & 0x3ff00) == 0;
      iVar4 = 5;
    }
    declets = iVar4 - (uint)bVar7;
  }
  else {
    local_28 = CONCAT44(iVar4 << 0x12 | uVar2 & 0x3ffff,(uint32_t)local_28);
    declets = 6;
  }
  decDigitsFromDPD(dn,(uint32_t *)&local_28,declets);
  return dn;
}

Assistant:

decNumber * decimal64ToNumber(const decimal64 *d64, decNumber *dn) {
  uInt msd;			   /* coefficient MSD */
  uInt exp;			   /* exponent top two bits */
  uInt comb;			   /* combination field */
  const uInt *pu;		   /* work */
  Int  need;			   /* .. */
  uInt sourar[2];		   /* source 64-bit */
  #define sourhi sourar[1]	   /* name the word with the sign */
  #define sourlo sourar[0]	   /* and the lower word */

  /* load source from storage; this is endian */
  pu=(const uInt *)d64->bytes;	   /* overlay */
  if (DECLITEND) {
    sourlo=pu[0];		   /* directly load the low int */
    sourhi=pu[1];		   /* then the high int */
    }
   else {
    sourhi=pu[0];		   /* directly load the high int */
    sourlo=pu[1];		   /* then the low int */
    }

  comb=(sourhi>>26)&0x1f;	   /* combination field */

  decNumberZero(dn);		   /* clean number */
  if (sourhi&0x80000000) dn->bits=DECNEG; /* set sign if negative */

  msd=COMBMSD[comb];		   /* decode the combination field */
  exp=COMBEXP[comb];		   /* .. */

  if (exp==3) {			   /* is a special */
    if (msd==0) {
      dn->bits|=DECINF;
      return dn;		   /* no coefficient needed */
      }
    else if (sourhi&0x02000000) dn->bits|=DECSNAN;
    else dn->bits|=DECNAN;
    msd=0;			   /* no top digit */
    }
   else {			   /* is a finite number */
    dn->exponent=(exp<<8)+((sourhi>>18)&0xff)-DECIMAL64_Bias; /* unbiased */
    }

  /* get the coefficient */
  sourhi&=0x0003ffff;		   /* clean coefficient continuation */
  if (msd) {			   /* non-zero msd */
    sourhi|=msd<<18;		   /* prefix to coefficient */
    need=6;			   /* process 6 declets */
    }
   else { /* msd=0 */
    if (!sourhi) {		   /* top word 0 */
      if (!sourlo) return dn;	   /* easy: coefficient is 0 */
      need=3;			   /* process at least 3 declets */
      if (sourlo&0xc0000000) need++; /* process 4 declets */
      /* [could reduce some more, here] */
      }
     else {			   /* some bits in top word, msd=0 */
      need=4;			   /* process at least 4 declets */
      if (sourhi&0x0003ff00) need++; /* top declet!=0, process 5 */
      }
    } /*msd=0 */

  decDigitsFromDPD(dn, sourar, need);	/* process declets */
  return dn;
  }